

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  int iVar1;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string *psVar3;
  undefined4 extraout_var;
  string output;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  RuleVariables vars;
  allocator<char> local_171;
  string local_170;
  string local_150;
  RuleVariables local_130;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&local_170);
  __s = cmMakefile::GetProperty(this_00,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_130);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_170);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_150,ccg);
      std::__cxx11::string::~string((string *)&local_150);
      if (local_150._M_string_length == 0) {
        psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&local_150,(cmLocalGenerator *)this,psVar3,&local_170);
        std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_150,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_170,SHELL);
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    local_130.Output = local_170._M_dataplus._M_p;
    iVar1 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    local_150._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_171);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar1),
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               __return_storage_ptr__,&local_130);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rule variables referenced in the given launcher command.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output = this->MaybeConvertToRelativePath(
        this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  std::string launcher = property_value;
  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}